

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_alias_tests.cpp
# Opt level: O0

int fixture_alias_tests::iu_ParamFixtureTest_x_iutest_x_Test2_Test::AddRegister(void)

{
  int iVar1;
  UnitTest *this;
  ParamTestSuiteHolder *this_00;
  ParamTestSuiteInfo<fixture_alias_tests::ParamFixtureTest> *this_01;
  string local_60;
  allocator<char> local_39;
  string local_38;
  
  if (AddRegister()::testinfo == '\0') {
    iVar1 = __cxa_guard_acquire(&AddRegister()::testinfo);
    if (iVar1 != 0) {
      iutest::detail::
      ParamTestInstance<fixture_alias_tests::iu_ParamFixtureTest_x_iutest_x_Test2_Test>::
      ParamTestInstance(&AddRegister::testinfo,"Test2");
      __cxa_atexit(iutest::detail::
                   ParamTestInstance<fixture_alias_tests::iu_ParamFixtureTest_x_iutest_x_Test2_Test>
                   ::~ParamTestInstance,&AddRegister::testinfo,&__dso_handle);
      __cxa_guard_release(&AddRegister()::testinfo);
    }
  }
  this = iutest::UnitTest::GetInstance();
  this_00 = iutest::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AliasName",&local_39);
  iuTest_GetTestSuitePackageName<iuTest_TestSuitePackage>(&local_60,(iuTest_TestSuitePackage *)0x0);
  this_01 = iutest::detail::ParamTestSuiteHolder::
            GetTestSuitePatternHolder<fixture_alias_tests::ParamFixtureTest>
                      (this_00,&local_38,&local_60);
  iutest::detail::IParamTestSuiteInfo::AddTestPattern
            (&this_01->super_IParamTestSuiteInfo,&AddRegister::testinfo.super_IParamTestInfoData);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return 0;
}

Assistant:

IUTEST_P(ParamTestAliasName, Test2)
{
    IUTEST_EXPECT_STREQ("AliasName", ::iuutil::TestSuiteNameRemoveInstantiateAndIndexName(
        ::iuutil::GetCurrentTestSuite()->name()) );
}